

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

bgp_peer * get_peer_by_string(string *search)

{
  pointer pbVar1;
  bool bVar2;
  char *__rhs;
  bgp_client_peer *peer;
  pointer pbVar3;
  
  pbVar1 = peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pbVar3 = peers.super__Vector_base<bgp_client_peer,_std::allocator<bgp_client_peer>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pbVar3 == pbVar1) {
      return (bgp_peer *)0x0;
    }
    __rhs = inet_ntoa((in_addr)(pbVar3->server_address).sin_addr.s_addr);
    bVar2 = std::operator==(search,__rhs);
    if (bVar2) break;
    pbVar3 = pbVar3 + 1;
  }
  return &pbVar3->super_bgp_peer;
}

Assistant:

bgp_peer* get_peer_by_string(const std::string& search){
    for(auto & peer : peers){
        if(search == inet_ntoa(peer.server_address.sin_addr)){
            return &peer;
        }
    }
    return nullptr;
}